

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite_vfs.cpp
# Opt level: O0

int anon_unknown.dwarf_364d1::xAccess(sqlite3_vfs *param_1,char *zName,int flags,int *pResOut)

{
  byte bVar1;
  uint *in_RCX;
  uint in_EDX;
  QByteArrayView *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  undefined4 in_stack_ffffffffffffffb8;
  storage_type_conflict *local_38;
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *in_RCX = 0;
  if ((in_EDX & 0xfffffffd) == 0) {
    QByteArrayView::QByteArrayView<const_char_*,_true>
              (in_RDI,(char **)CONCAT44(in_EDX,in_stack_ffffffffffffffb8));
    QVar2.m_data = local_38;
    QVar2.m_size = (qsizetype)local_28;
    QString::fromUtf8(QVar2);
    bVar1 = QFile::exists((QString *)local_28);
    *in_RCX = (uint)(bVar1 & 1);
    QString::~QString((QString *)0x130b04);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

int xAccess(sqlite3_vfs */*svfs*/, const char *zName, int flags, int *pResOut)
{
    *pResOut = 0;
    switch (flags) {
    case SQLITE_ACCESS_EXISTS:
    case SQLITE_ACCESS_READ:
        *pResOut = QFile::exists(QString::fromUtf8(zName));
        break;
    default:
        break;
    }
    return SQLITE_OK;
}